

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::L1Distance::dim_forward
          (Dim *__return_storage_ptr__,L1Distance *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  uint b;
  pointer pDVar2;
  bool bVar3;
  ostream *os;
  invalid_argument *this_00;
  initializer_list<unsigned_int> x;
  Dim r_1;
  Dim r;
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar2 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x367,"virtual Dim cnn::L1Distance::dim_forward(const vector<Dim> &) const");
  }
  r.d._0_8_ = *(undefined8 *)pDVar2->d;
  r.d._8_8_ = *(undefined8 *)(pDVar2->d + 2);
  r.d._16_8_ = *(undefined8 *)(pDVar2->d + 4);
  r._24_8_ = *(undefined8 *)(pDVar2->d + 6);
  r_1.bd = 1;
  r_1.d._0_8_ = *(undefined8 *)pDVar2[1].d;
  r_1.d._8_8_ = *(undefined8 *)(pDVar2[1].d + 2);
  r_1.d._16_8_ = *(undefined8 *)(pDVar2[1].d + 4);
  r_1._24_8_ = *(undefined8 *)(pDVar2[1].d + 6);
  r.bd = r_1.bd;
  bVar3 = operator!=(&r,&r_1);
  if (!bVar3) {
    r.d[0] = 1;
    pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = pDVar2->bd;
    b = pDVar2[1].bd;
    if (b < uVar1) {
      b = uVar1;
    }
    x._M_len = 1;
    x._M_array = r.d;
    Dim::Dim(__return_storage_ptr__,x,b);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&r);
  os = std::operator<<((ostream *)&r,"Mismatched input dimensions in L1Distance: ");
  operator<<(os,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,(string *)&r_1);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}